

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O3

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,float val)

{
  size_t sVar1;
  char buffer [128];
  char acStack_98 [136];
  
  snprintf(acStack_98,0x80,"%g",(double)val);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_98,acStack_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(float val) {
  char buffer[128];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%g", static_cast<double>(val));
#else
  snprintf(buffer, sizeof(buffer), "%g", static_cast<double>(val));
#endif
  return buffer;
}